

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *
capnp::_::anon_unknown_0::getCallSequence
          (RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
           *__return_storage_ptr__,Client *client,uint expected)

{
  RequestHook *pRVar1;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  req;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  RStack_68;
  Maybe<capnp::MessageSize> local_30;
  
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&RStack_68,client,&local_30);
  *(uint *)RStack_68.super_Builder._builder.data = expected;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send((Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
          *)__return_storage_ptr__,(int)&RStack_68,__buf,in_RCX,in_R8D);
  pRVar1 = RStack_68.hook.ptr;
  if (RStack_68.hook.ptr != (RequestHook *)0x0) {
    RStack_68.hook.ptr = (RequestHook *)0x0;
    (**(RStack_68.hook.disposer)->_vptr_Disposer)
              (RStack_68.hook.disposer,
               (_func_int *)((long)&pRVar1->_vptr_RequestHook + (long)pRVar1->_vptr_RequestHook[-2])
              );
  }
  return __return_storage_ptr__;
}

Assistant:

RemotePromise<test::TestCallOrder::GetCallSequenceResults> getCallSequence(
    test::TestCallOrder::Client& client, uint expected) {
  auto req = client.getCallSequenceRequest();
  req.setExpected(expected);
  return req.send();
}